

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
* __thiscall
(anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmTarget *Target,
          cmGlobalGenerator *globalGenerator)

{
  size_t sVar1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  mapped_type *pmVar8;
  char *local_1b8;
  char *local_1a0;
  _Self local_158;
  _Self local_150;
  cmTarget *local_148;
  cmTarget *tgt_1;
  string element_1;
  cmTarget *tgt;
  string element;
  string local_f0 [8];
  string linkLibraries;
  string local_c8 [8];
  string interfaceLinkLibraries;
  string local_a0;
  char *local_80;
  char *pLinkLibraries;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *pInterfaceLinkLibraries;
  size_t end;
  size_t start;
  cmGlobalGenerator *pcStack_20;
  char sep;
  cmGlobalGenerator *globalGenerator_local;
  cmTarget *Target_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  *tokens;
  
  start._7_1_ = ';';
  start._6_1_ = 0;
  pcStack_20 = (cmGlobalGenerator *)Target;
  globalGenerator_local = (cmGlobalGenerator *)this;
  Target_local = (cmTarget *)__return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  ::map(__return_storage_ptr__);
  pcVar2 = globalGenerator_local;
  end = 0;
  pInterfaceLinkLibraries = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"INTERFACE_LINK_LIBRARIES",&local_61);
  pcVar4 = cmTarget::GetProperty((cmTarget *)pcVar2,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar2 = globalGenerator_local;
  local_40 = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"LINK_LIBRARIES",
             (allocator<char> *)(interfaceLinkLibraries.field_2._M_local_buf + 0xf));
  pcVar4 = cmTarget::GetProperty((cmTarget *)pcVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(interfaceLinkLibraries.field_2._M_local_buf + 0xf));
  local_80 = pcVar4;
  if ((local_40 == (char *)0x0) && (pcVar4 == (char *)0x0)) {
    start._6_1_ = 1;
    interfaceLinkLibraries.field_2._8_4_ = 1;
  }
  else {
    if (local_40 == (char *)0x0) {
      local_1a0 = "";
    }
    else {
      local_1a0 = local_40;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,local_1a0,(allocator<char> *)(linkLibraries.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(linkLibraries.field_2._M_local_buf + 0xf));
    if (local_80 == (char *)0x0) {
      local_1b8 = "";
    }
    else {
      local_1b8 = local_80;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,local_1b8,(allocator<char> *)(element.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(element.field_2._M_local_buf + 0xf));
    while (sVar1 = end, uVar5 = std::__cxx11::string::length(), sVar1 < uVar5) {
      pInterfaceLinkLibraries =
           (char *)std::__cxx11::string::find((char)local_c8,(ulong)(uint)(int)start._7_1_);
      if (pInterfaceLinkLibraries == (char *)0xffffffffffffffff) {
        pInterfaceLinkLibraries = (char *)std::__cxx11::string::length();
      }
      std::__cxx11::string::substr((ulong)&tgt,(ulong)local_c8);
      bVar3 = cmGlobalGenerator::IsAlias(pcStack_20,(string *)&tgt);
      if ((bVar3) &&
         (element_1.field_2._8_8_ = cmGlobalGenerator::FindTarget(pcStack_20,(string *)&tgt,false),
         (cmTarget *)element_1.field_2._8_8_ != (cmTarget *)0x0)) {
        psVar6 = cmTarget::GetName_abi_cxx11_((cmTarget *)element_1.field_2._8_8_);
        std::__cxx11::string::operator=((string *)&tgt,(string *)psVar6);
      }
      lVar7 = std::__cxx11::string::find((char *)&tgt,0x7acf12);
      if (lVar7 == -1) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&tgt);
        *pmVar8 = LLT_SCOPE_INTERFACE;
      }
      end = (size_t)(pInterfaceLinkLibraries + 1);
      std::__cxx11::string::~string((string *)&tgt);
    }
    end = 0;
    while (sVar1 = end, uVar5 = std::__cxx11::string::length(), sVar1 < uVar5) {
      pInterfaceLinkLibraries =
           (char *)std::__cxx11::string::find((char)local_f0,(ulong)(uint)(int)start._7_1_);
      if (pInterfaceLinkLibraries == (char *)0xffffffffffffffff) {
        pInterfaceLinkLibraries = (char *)std::__cxx11::string::length();
      }
      std::__cxx11::string::substr((ulong)&tgt_1,(ulong)local_f0);
      bVar3 = cmGlobalGenerator::IsAlias(pcStack_20,(string *)&tgt_1);
      if ((bVar3) &&
         (local_148 = cmGlobalGenerator::FindTarget(pcStack_20,(string *)&tgt_1,false),
         local_148 != (cmTarget *)0x0)) {
        psVar6 = cmTarget::GetName_abi_cxx11_(local_148);
        std::__cxx11::string::operator=((string *)&tgt_1,(string *)psVar6);
      }
      local_150._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           ::find(__return_storage_ptr__,(key_type *)&tgt_1);
      local_158._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           ::end(__return_storage_ptr__);
      bVar3 = std::operator==(&local_150,&local_158);
      if (bVar3) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&tgt_1);
        *pmVar8 = LLT_SCOPE_PRIVATE;
      }
      else {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&tgt_1);
        if (*pmVar8 == LLT_SCOPE_INTERFACE) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)&tgt_1);
          *pmVar8 = LLT_SCOPE_PUBLIC;
        }
      }
      end = (size_t)(pInterfaceLinkLibraries + 1);
      std::__cxx11::string::~string((string *)&tgt_1);
    }
    start._6_1_ = 1;
    interfaceLinkLibraries.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_c8);
  }
  if ((start._6_1_ & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, LinkLibraryScopeType> getScopedLinkLibrariesFromTarget(
  cmTarget* Target, const cmGlobalGenerator* globalGenerator)
{
  char sep = ';';
  std::map<std::string, LinkLibraryScopeType> tokens;
  size_t start = 0, end = 0;

  const char* pInterfaceLinkLibraries =
    Target->GetProperty("INTERFACE_LINK_LIBRARIES");
  const char* pLinkLibraries = Target->GetProperty("LINK_LIBRARIES");

  if (!pInterfaceLinkLibraries && !pLinkLibraries) {
    return tokens; // target is not linked against any other libraries
  }

  // make sure we don't touch a null-ptr
  auto interfaceLinkLibraries =
    std::string(pInterfaceLinkLibraries ? pInterfaceLinkLibraries : "");
  auto linkLibraries = std::string(pLinkLibraries ? pLinkLibraries : "");

  // first extract interfaceLinkLibraries
  while (start < interfaceLinkLibraries.length()) {

    if ((end = interfaceLinkLibraries.find(sep, start)) == std::string::npos) {
      end = interfaceLinkLibraries.length();
    }

    std::string element = interfaceLinkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (std::string::npos == element.find("$<LINK_ONLY:", 0)) {
      // we assume first, that this library is an interface library.
      // if we find it again in the linklibraries property, we promote it to an
      // public library.
      tokens[element] = LLT_SCOPE_INTERFACE;
    } else {
      // this is an private linked static library.
      // we take care of this case in the second iterator.
    }
    start = end + 1;
  }

  // second extract linkLibraries
  start = 0;
  while (start < linkLibraries.length()) {

    if ((end = linkLibraries.find(sep, start)) == std::string::npos) {
      end = linkLibraries.length();
    }

    std::string element = linkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (tokens.find(element) == tokens.end()) {
      // this library is not found in interfaceLinkLibraries but in
      // linkLibraries.
      // this results in a private linked library.
      tokens[element] = LLT_SCOPE_PRIVATE;
    } else if (LLT_SCOPE_INTERFACE == tokens[element]) {
      // this library is found in interfaceLinkLibraries and linkLibraries.
      // this results in a public linked library.
      tokens[element] = LLT_SCOPE_PUBLIC;
    } else {
      // private and public linked libraries should not be changed anymore.
    }

    start = end + 1;
  }

  return tokens;
}